

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O2

PF_FileHandle * __thiscall PF_FileHandle::operator=(PF_FileHandle *this,PF_FileHandle *fileHandle)

{
  int iVar1;
  
  if (this != fileHandle) {
    this->pBufferMgr = fileHandle->pBufferMgr;
    this->hdr = fileHandle->hdr;
    iVar1 = fileHandle->bHdrChanged;
    this->bFileOpen = fileHandle->bFileOpen;
    this->bHdrChanged = iVar1;
    this->unixfd = fileHandle->unixfd;
  }
  return this;
}

Assistant:

PF_FileHandle& PF_FileHandle::operator= (const PF_FileHandle &fileHandle)
{
   // Test for self-assignment
   if (this != &fileHandle) {

      // Just copy the members since there is no memory allocation involved
      this->pBufferMgr  = fileHandle.pBufferMgr;
      this->hdr         = fileHandle.hdr;
      this->bFileOpen   = fileHandle.bFileOpen;
      this->bHdrChanged = fileHandle.bHdrChanged;
      this->unixfd      = fileHandle.unixfd;
   }

   // Return a reference to this
   return (*this);
}